

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLstack.c
# Opt level: O1

void RDL_stack_push(RDL_stack *stack,void *element)

{
  void **ppvVar1;
  void **ppvVar2;
  uint uVar3;
  void **ppvVar4;
  
  if (stack->size == stack->reserved) {
    uVar3 = stack->reserved * 2;
    stack->reserved = uVar3;
    ppvVar1 = stack->elements;
    ppvVar2 = stack->top;
    ppvVar4 = (void **)realloc(ppvVar1,(ulong)uVar3 << 3);
    stack->elements = ppvVar4;
    stack->top = (void **)(((long)ppvVar2 - (long)ppvVar1 & 0x7fffffff8U) + (long)ppvVar4);
  }
  ppvVar1 = stack->top;
  stack->top = ppvVar1 + 1;
  stack->size = stack->size + 1;
  ppvVar1[1] = element;
  return;
}

Assistant:

void RDL_stack_push(RDL_stack* stack, void* element)
{
  unsigned distance;

  if (stack->size == stack->reserved) {
    stack->reserved *= 2;

    distance = stack->top - stack->elements;

    stack->elements = realloc(stack->elements,
        stack->reserved * sizeof(*stack->elements));

    stack->top = stack->elements + distance;
  }
  ++stack->top;
  ++stack->size;
  *stack->top = element;
}